

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.h
# Opt level: O2

Vector3f __thiscall Texture::get(Texture *this,Vector2f *x)

{
  float fVar1;
  Vector2f *x_00;
  float fVar2;
  undefined8 uVar3;
  float *pfVar4;
  Vector2f *in_RDX;
  int b;
  undefined8 in_XMM0_Qa;
  undefined1 auVar5 [16];
  undefined1 in_ZMM1 [64];
  undefined4 in_XMM3_Da;
  undefined1 in_register_000012c4 [12];
  Vector3f VVar6;
  Vector3f VVar7;
  anon_class_8_1_8991fb9c pix;
  Vector3f local_e8;
  Vector2f local_dc;
  undefined1 local_d4 [20];
  Vector3f local_c0;
  Vector3f local_b4;
  anon_class_8_1_8991fb9c local_a8;
  Vector3f local_9c;
  Vector3f local_90;
  anon_class_8_1_8991fb9c local_84;
  Vector3f local_78;
  Vector3f local_6c;
  anon_class_8_1_8991fb9c local_60;
  Vector3f local_54;
  Vector3f local_48;
  Vector3f local_3c;
  undefined8 uVar8;
  float fVar9;
  
  auVar5 = in_ZMM1._0_16_;
  if (x->m_elements[0] == 2.8026e-45) {
    pix.this = (Texture *)x;
    pfVar4 = Vector2f::operator[](in_RDX,0);
    fVar1 = *pfVar4;
    pfVar4 = Vector2f::operator[](in_RDX,0);
    auVar5 = vroundss_avx(auVar5,ZEXT416((uint)*pfVar4),9);
    auVar5 = ZEXT416((uint)(fVar1 - auVar5._0_4_));
    uVar3 = vcmpss_avx512f(auVar5,ZEXT816(0) << 0x40,1);
    auVar5 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar5);
    fVar2 = (float)((uint)!(bool)((byte)uVar3 & 1) * auVar5._0_4_) *
            (float)((int)x[8].m_elements[0] + -1);
    pfVar4 = Vector2f::operator[](in_RDX,1);
    fVar1 = *pfVar4;
    pfVar4 = Vector2f::operator[](in_RDX,1);
    auVar5._4_12_ = in_register_000012c4;
    auVar5._0_4_ = in_XMM3_Da;
    auVar5 = vroundss_avx(auVar5,ZEXT416((uint)*pfVar4),9);
    auVar5 = ZEXT416((uint)(fVar1 - auVar5._0_4_));
    uVar3 = vcmpss_avx512f(auVar5,ZEXT816(0) << 0x40,1);
    auVar5 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar5);
    fVar1 = (float)((uint)!(bool)((byte)uVar3 & 1) * auVar5._0_4_) *
            (float)((int)x[8].m_elements[1] + -1);
    b = (int)fVar2;
    auVar5 = vcvtdq2ps_avx(ZEXT416((uint)(int)fVar2));
    fVar2 = fVar2 - auVar5._0_4_;
    auVar5 = vcvtdq2ps_avx(ZEXT416((uint)(int)fVar1));
    fVar1 = fVar1 - auVar5._0_4_;
    get::anon_class_8_1_8991fb9c::operator()(&local_60,(int)&pix,b);
    ::operator*(&local_54,1.0 - fVar2);
    ::operator*(&local_e8,1.0 - fVar1);
    get::anon_class_8_1_8991fb9c::operator()(&local_84,(int)&pix,b);
    ::operator*(&local_78,1.0 - fVar2);
    ::operator*(&local_6c,fVar1);
    operator+(&local_e8,&local_6c);
    get::anon_class_8_1_8991fb9c::operator()(&local_a8,(int)&pix,b + 1);
    ::operator*(&local_9c,fVar2);
    ::operator*(&local_90,1.0 - fVar1);
    operator+(&local_48,&local_90);
    get::anon_class_8_1_8991fb9c::operator()
              ((anon_class_8_1_8991fb9c *)(local_d4 + 8),(int)&pix,b + 1);
    ::operator*(&local_c0,fVar2);
    ::operator*(&local_b4,fVar1);
    VVar6 = operator+(&local_3c,&local_b4);
  }
  else if (x->m_elements[0] == 1.4013e-45) {
    x_00 = *(Vector2f **)x[1].m_elements;
    Vector2f::Vector2f(&local_dc,in_RDX);
    std::function<Vector2f_(Vector2f)>::operator()((function<Vector2f_(Vector2f)> *)local_d4,x + 4);
    VVar6 = get(this,x_00);
  }
  else {
    Vector3f::Vector3f((Vector3f *)this,(Vector3f *)(x + 2));
    VVar6.m_elements[2] = in_ZMM1._0_4_;
    VVar6.m_elements[0] = (float)(int)in_XMM0_Qa;
    VVar6.m_elements[1] = (float)(int)((ulong)in_XMM0_Qa >> 0x20);
  }
  VVar7.m_elements[0] = VVar6.m_elements[0];
  uVar8._4_4_ = VVar6.m_elements[1];
  register0x00001240 = VVar6.m_elements[2];
  return (Vector3f)VVar7.m_elements;
}

Assistant:

Vector3f get(Vector2f x) const
	{
		switch (type)
		{
		case TEXTURE_COLOR: return color;
		case TEXTURE_SCALE:
			/*
			std::cerr << source << "!!\n";
			std::cerr << x[0] << "," << x[1] << "\n";
			std::cerr << scale(x)[0] << "|" << scale(x)[1] << "\n";*/
			return source->get(scale(x));
		case TEXTURE_RECT:
			auto pix = [&](int a, int b) {
				if (a < 0 || b < 0 || a >= image_w || b >= image_h)
					return Vector3f::ZERO;
				Vector3f g;
				if (image_buff_stbi != nullptr) {
					for (int x = 0; x < 3; ++x)
						g[x] = image_buff_stbi[a * image_c + b * image_w * image_c + x] / 255.0;
				}
				else {
					for (int x = 0; x < 3; ++x)
						g[x] = hdr_buff[b * image_c + a * image_h * image_c + x];// 0.8);
				}
				return g;
			};
			float a = clamp(x[0]-floor(x[0])) * (image_w - 1), b = clamp(x[1]-floor(x[1])) * (image_h - 1);
			//return pix(int(a + 0.5), int(b + 0.5));
			int l = a, r = b; float p = a - l, q = b - r;
			return pix(l, r) * (1 - p) * (1 - q) + pix(l, r + 1) * (1 - p) * q + pix(l + 1, r) * p * (1 - q) + pix(l + 1, r + 1) * p * q;
		}
	}